

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

float __thiscall
deqp::gls::BuiltinPrecisionTests::DefaultSampling<float>::genRandom
          (DefaultSampling<float> *this,FloatFormat *format,Precision param_2,Random *rnd)

{
  int iVar1;
  double dVar2;
  deUint32 dVar3;
  uint uVar4;
  int iVar5;
  deUint32 dVar6;
  int __exponent;
  float fVar7;
  float fVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  iVar5 = format->m_minExp;
  dVar10 = 0.0;
  if (format->m_hasSubnormal != NO) {
    dVar10 = 1.0;
  }
  dVar10 = ((double)iVar5 + -0.5) - dVar10;
  dVar11 = -dVar10;
  iVar1 = format->m_maxExp;
  dVar9 = pow((double)(~-(ulong)(dVar11 <= dVar10) & (ulong)dVar11 |
                      (ulong)dVar10 & -(ulong)(dVar11 <= dVar10)),0.3333333333333333);
  dVar2 = (double)iVar1 + 0.5;
  dVar12 = -dVar2;
  dVar9 = dVar9 * (double)(int)((uint)(dVar11 < dVar10) - (uint)(dVar10 < dVar11));
  dVar10 = pow((double)(-(ulong)(dVar12 <= dVar2) & (ulong)dVar2 |
                       ~-(ulong)(dVar12 <= dVar2) & (ulong)dVar12),0.3333333333333333);
  iVar1 = format->m_fractionBits;
  dVar11 = deRandom_getDouble(&rnd->m_rnd);
  dVar10 = pow(dVar11 * (dVar10 * (double)(int)((uint)(dVar12 < dVar2) - (uint)(dVar2 < dVar12)) -
                        dVar9) + dVar9,3.0);
  dVar10 = deRoundEven(dVar10);
  dVar3 = deRandom_getUint32(&rnd->m_rnd);
  uVar4 = dVar3 - (((uint)((ulong)dVar3 * 0xfc0fc0fd >> 0x20) & 0xffffffc0) + dVar3 / 0x41);
  if (uVar4 < 4) {
    fVar7 = *(float *)(&DAT_009d42f0 + (ulong)uVar4 * 4);
  }
  else {
    __exponent = (int)dVar10;
    fVar7 = 0.0;
    if (iVar5 <= __exponent) {
      fVar7 = ldexpf(1.0,__exponent);
      iVar5 = __exponent;
    }
    fVar8 = ldexpf(1.0,iVar5 - iVar1);
    dVar3 = deRandom_getUint32(&rnd->m_rnd);
    dVar6 = ((uint)((ulong)dVar3 * 0xf0f0f0f1 >> 0x20) & 0xfffffff0) + dVar3 / 0x11;
    iVar5 = dVar3 - dVar6;
    if (iVar5 == 2) {
      fVar8 = 0.0;
    }
    else if (iVar5 != 1) {
      if (dVar3 == dVar6) {
        fVar8 = fVar7 - fVar8;
      }
      else {
        deRandom_getUint32(&rnd->m_rnd);
        dVar3 = deRandom_getUint32(&rnd->m_rnd);
        fVar8 = fVar8 * (float)(int)(~(-1 << ((byte)iVar1 & 0x1f)) & dVar3);
      }
    }
    dVar3 = deRandom_getUint32(&rnd->m_rnd);
    fVar7 = fVar7 + fVar8;
    if ((dVar3 & 3) == 0) {
      fVar7 = -fVar7;
    }
  }
  return fVar7;
}

Assistant:

float DefaultSampling<float>::genRandom (const FloatFormat& format,
										 Precision,
										 Random&			rnd) const
{
	const int		minExp			= format.getMinExp();
	const int		maxExp			= format.getMaxExp();
	const bool		haveSubnormal	= format.hasSubnormal() != tcu::NO;

	// Choose exponent so that the cumulative distribution is cubic.
	// This makes the probability distribution quadratic, with the peak centered on zero.
	const double	minRoot			= deCbrt(minExp - 0.5 - (haveSubnormal ? 1.0 : 0.0));
	const double	maxRoot			= deCbrt(maxExp + 0.5);
	const int		fractionBits	= format.getFractionBits();
	const int		exp				= int(deRoundEven(dePow(rnd.getDouble(minRoot, maxRoot),
															3.0)));
	float			base			= 0.0f; // integral power of two
	float			quantum			= 0.0f; // smallest representable difference in the binade
	float			significand		= 0.0f; // Significand.

	DE_ASSERT(fractionBits < std::numeric_limits<float>::digits);

	// Generate some occasional special numbers
	switch (rnd.getInt(0, 64))
	{
		case 0:		return 0;
		case 1:		return TCU_INFINITY;
		case 2:		return -TCU_INFINITY;
		case 3:		return TCU_NAN;
		default:	break;
	}

	if (exp >= minExp)
	{
		// Normal number
		base = deFloatLdExp(1.0f, exp);
		quantum = deFloatLdExp(1.0f, exp - fractionBits);
	}
	else
	{
		// Subnormal
		base = 0.0f;
		quantum = deFloatLdExp(1.0f, minExp - fractionBits);
	}

	switch (rnd.getInt(0, 16))
	{
		case 0: // The highest number in this binade, significand is all bits one.
			significand = base - quantum;
			break;
		case 1: // Significand is one.
			significand = quantum;
			break;
		case 2: // Significand is zero.
			significand = 0.0;
			break;
		default: // Random (evenly distributed) significand.
		{
			deUint64 intFraction = rnd.getUint64() & ((1 << fractionBits) - 1);
			significand = float(intFraction) * quantum;
		}
	}

	// Produce positive numbers more often than negative.
	return (rnd.getInt(0,3) == 0 ? -1.0f : 1.0f) * (base + significand);
}